

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O3

void __thiscall Fl_Graphics_Driver::gap(Fl_Graphics_Driver *this)

{
  short sVar1;
  short sVar2;
  XPoint *pXVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  lVar5 = (long)this->gap_;
  iVar6 = this->n;
  lVar4 = (long)iVar6;
  if ((int)(lVar5 + 2) < iVar6) {
    pXVar3 = this->p;
    sVar1 = pXVar3[lVar5].x;
    sVar2 = pXVar3[lVar5].y;
    do {
      iVar6 = iVar6 + -1;
      if ((pXVar3[lVar4 + -1].x != sVar1) || (pXVar3[lVar4 + -1].y != sVar2)) {
        (*(this->super_Fl_Device)._vptr_Fl_Device[0x29])((double)(int)sVar1,(double)(int)sVar2,this)
        ;
        this->gap_ = this->n;
        return;
      }
      lVar4 = lVar4 + -1;
      this->n = iVar6;
    } while (lVar5 + 2 < lVar4);
  }
  this->n = this->gap_;
  return;
}

Assistant:

void Fl_Graphics_Driver::gap() {
  while (n>gap_+2 && p[n-1].x == p[gap_].x && p[n-1].y == p[gap_].y) n--;
  if (n > gap_+2) {
    transformed_vertex((COORD_T)p[gap_].x, (COORD_T)p[gap_].y);
#if defined(WIN32)
    counts[numcount++] = n-gap_;
#endif
    gap_ = n;
  } else {
    n = gap_;
  }
}